

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::pipeline::anon_unknown_0::createSingleAttributeTests
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx)

{
  undefined8 uVar1;
  bool bVar2;
  TestCaseGroup *this;
  TestNode *pTVar3;
  VertexInputTest *pVVar4;
  AttributeInfo *attributeInfo_00;
  AttributeInfo *attributeInfo_01;
  AttributeInfo *attributeInfo_02;
  AttributeInfo *attributeInfo_03;
  allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo> local_211;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  local_210;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b2;
  allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo> local_1b1;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  local_1b0;
  string local_198;
  string local_178;
  undefined1 local_154 [8];
  AttributeInfo attributeInfo;
  int glslTypeNdx;
  int formatNdx;
  undefined1 local_129;
  VkFormat local_128 [2];
  VkFormat vertexFormats [68];
  TestContext *testCtx_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *singleAttributeTests;
  
  vertexFormats._264_8_ = testCtx;
  memcpy(local_128,&DAT_012d1000,0x110);
  local_129 = 0;
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (this,(TestContext *)vertexFormats._264_8_,"single_attribute","Uses one attribute");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&glslTypeNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            (__return_storage_ptr__,this);
  for (attributeInfo.inputRate = VK_VERTEX_INPUT_RATE_VERTEX; (int)attributeInfo.inputRate < 0x44;
      attributeInfo.inputRate = attributeInfo.inputRate + VK_VERTEX_INPUT_RATE_INSTANCE) {
    for (attributeInfo.vkType = VK_FORMAT_UNDEFINED; (int)attributeInfo.vkType < 0x16;
        attributeInfo.vkType = attributeInfo.vkType + VK_FORMAT_R4G4_UNORM_PACK8) {
      bVar2 = VertexInputTest::isCompatibleType
                        (vertexFormats[(long)(int)attributeInfo.inputRate + -2],attributeInfo.vkType
                        );
      if (bVar2) {
        local_154._4_4_ = vertexFormats[(long)(int)attributeInfo.inputRate + -2];
        local_154._0_4_ = attributeInfo.vkType;
        attributeInfo.glslType = GLSL_TYPE_INT;
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pVVar4 = (VertexInputTest *)operator_new(0x98);
        uVar1 = vertexFormats._264_8_;
        local_1b2 = 1;
        pipeline::(anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  (&local_178,(_anonymous_namespace_ *)local_154,attributeInfo_00);
        pipeline::(anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  (&local_198,(_anonymous_namespace_ *)local_154,attributeInfo_01);
        std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>::
        allocator(&local_1b1);
        std::
        vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::vector(&local_1b0,1,(value_type *)local_154,&local_1b1);
        VertexInputTest::VertexInputTest
                  (pVVar4,(TestContext *)uVar1,&local_178,&local_198,&local_1b0,
                   BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
        local_1b2 = 0;
        tcu::TestNode::addChild(pTVar3,(TestNode *)pVVar4);
        std::
        vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::~vector(&local_1b0);
        std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>::
        ~allocator(&local_1b1);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_178);
        attributeInfo.glslType = GLSL_TYPE_IVEC2;
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pVVar4 = (VertexInputTest *)operator_new(0x98);
        uVar1 = vertexFormats._264_8_;
        pipeline::(anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  (&local_1d8,(_anonymous_namespace_ *)local_154,attributeInfo_02);
        pipeline::(anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  (&local_1f8,(_anonymous_namespace_ *)local_154,attributeInfo_03);
        std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>::
        allocator(&local_211);
        std::
        vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::vector(&local_210,1,(value_type *)local_154,&local_211);
        VertexInputTest::VertexInputTest
                  (pVVar4,(TestContext *)uVar1,&local_1d8,&local_1f8,&local_210,
                   BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar3,(TestNode *)pVVar4);
        std::
        vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ::~vector(&local_210);
        std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>::
        ~allocator(&local_211);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<tcu::TestCaseGroup> createSingleAttributeTests (tcu::TestContext& testCtx)
{
	const VkFormat vertexFormats[] =
	{
		// Required, unpacked
		VK_FORMAT_R8_UNORM,
		VK_FORMAT_R8_SNORM,
		VK_FORMAT_R8_UINT,
		VK_FORMAT_R8_SINT,
		VK_FORMAT_R8G8_UNORM,
		VK_FORMAT_R8G8_SNORM,
		VK_FORMAT_R8G8_UINT,
		VK_FORMAT_R8G8_SINT,
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R8G8B8A8_SNORM,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_B8G8R8A8_UNORM,
		VK_FORMAT_R16_UNORM,
		VK_FORMAT_R16_SNORM,
		VK_FORMAT_R16_UINT,
		VK_FORMAT_R16_SINT,
		VK_FORMAT_R16_SFLOAT,
		VK_FORMAT_R16G16_UNORM,
		VK_FORMAT_R16G16_SNORM,
		VK_FORMAT_R16G16_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R16G16_SFLOAT,
		VK_FORMAT_R16G16B16A16_UNORM,
		VK_FORMAT_R16G16B16A16_SNORM,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R32_SINT,
		VK_FORMAT_R32_SFLOAT,
		VK_FORMAT_R32G32_UINT,
		VK_FORMAT_R32G32_SINT,
		VK_FORMAT_R32G32_SFLOAT,
		VK_FORMAT_R32G32B32_UINT,
		VK_FORMAT_R32G32B32_SINT,
		VK_FORMAT_R32G32B32_SFLOAT,
		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,

		// Scaled formats
		VK_FORMAT_R8G8_USCALED,
		VK_FORMAT_R8G8_SSCALED,
		VK_FORMAT_R16_USCALED,
		VK_FORMAT_R16_SSCALED,
		VK_FORMAT_R8G8B8_USCALED,
		VK_FORMAT_R8G8B8_SSCALED,
		VK_FORMAT_B8G8R8_USCALED,
		VK_FORMAT_B8G8R8_SSCALED,
		VK_FORMAT_R8G8B8A8_USCALED,
		VK_FORMAT_R8G8B8A8_SSCALED,
		VK_FORMAT_B8G8R8A8_USCALED,
		VK_FORMAT_B8G8R8A8_SSCALED,
		VK_FORMAT_R16G16_USCALED,
		VK_FORMAT_R16G16_SSCALED,
		VK_FORMAT_R16G16B16_USCALED,
		VK_FORMAT_R16G16B16_SSCALED,
		VK_FORMAT_R16G16B16A16_USCALED,
		VK_FORMAT_R16G16B16A16_SSCALED,

		// SRGB formats
		VK_FORMAT_R8_SRGB,
		VK_FORMAT_R8G8_SRGB,
		VK_FORMAT_R8G8B8_SRGB,
		VK_FORMAT_B8G8R8_SRGB,
		VK_FORMAT_R8G8B8A8_SRGB,
		VK_FORMAT_B8G8R8A8_SRGB,

		// Double formats
		VK_FORMAT_R64_SFLOAT,
		VK_FORMAT_R64G64_SFLOAT,
		VK_FORMAT_R64G64B64_SFLOAT,
		VK_FORMAT_R64G64B64A64_SFLOAT,
	};

	de::MovePtr<tcu::TestCaseGroup>	singleAttributeTests (new tcu::TestCaseGroup(testCtx, "single_attribute", "Uses one attribute"));

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(vertexFormats); formatNdx++)
	{
		for (int glslTypeNdx = 0; glslTypeNdx < VertexInputTest::GLSL_TYPE_COUNT; glslTypeNdx++)
		{
			if (VertexInputTest::isCompatibleType(vertexFormats[formatNdx], (VertexInputTest::GlslType)glslTypeNdx))
			{
				// Create test case for RATE_VERTEX
				VertexInputTest::AttributeInfo attributeInfo;
				attributeInfo.vkType	= vertexFormats[formatNdx];
				attributeInfo.glslType	= (VertexInputTest::GlslType)glslTypeNdx;
				attributeInfo.inputRate	= VK_VERTEX_INPUT_RATE_VERTEX;

				singleAttributeTests->addChild(new VertexInputTest(testCtx,
																   getAttributeInfoCaseName(attributeInfo),
																   getAttributeInfoDescription(attributeInfo),
																   std::vector<VertexInputTest::AttributeInfo>(1, attributeInfo),
																   VertexInputTest::BINDING_MAPPING_ONE_TO_ONE,
																   VertexInputTest::ATTRIBUTE_LAYOUT_INTERLEAVED));

				// Create test case for RATE_INSTANCE
				attributeInfo.inputRate	= VK_VERTEX_INPUT_RATE_INSTANCE;

				singleAttributeTests->addChild(new VertexInputTest(testCtx,
																   getAttributeInfoCaseName(attributeInfo),
																   getAttributeInfoDescription(attributeInfo),
																   std::vector<VertexInputTest::AttributeInfo>(1, attributeInfo),
																   VertexInputTest::BINDING_MAPPING_ONE_TO_ONE,
																   VertexInputTest::ATTRIBUTE_LAYOUT_INTERLEAVED));
			}
		}
	}

	return singleAttributeTests;
}